

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType re,RealType alpha,RealType beta,
          RealType A,RealType B,RealType kappa,RealType lambda)

{
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  long lVar3;
  int i;
  int iVar4;
  long lVar5;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar6;
  pair<double,_double> pVar7;
  int atid2;
  int atid1;
  RealType r;
  CubicSplinePtr cs;
  vector<double,_std::allocator<double>_> jVals;
  vector<double,_std::allocator<double>_> phiVals;
  vector<double,_std::allocator<double>_> rVals;
  EAMInteractionData mixer;
  int local_14c;
  RealType local_148;
  double local_140;
  RealType local_138;
  __shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> local_130;
  AtomType *local_120;
  AtomType *local_118;
  RealType local_110;
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  RealType local_f0;
  RealType local_e8;
  double local_e0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  _Vector_base<double,_std::allocator<double>_> local_98;
  EAMInteractionData local_78;
  
  local_140 = re;
  local_120 = atype2;
  local_118 = atype1;
  local_110 = alpha;
  local_108 = beta;
  local_100 = A;
  local_f8 = B;
  local_f0 = kappa;
  local_e8 = lambda;
  std::make_shared<OpenMD::CubicSpline>();
  local_78.Ci = 0.0;
  local_78.Cj = 0.0;
  local_78.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_78.phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = local_140 * 4.0;
  if (local_e0 <= 9.0) {
    local_e0 = 9.0;
  }
  if (12.0 <= local_e0) {
    local_e0 = 12.0;
  }
  local_e0 = local_e0 / 1999.0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar4 = 0; iVar4 != 2000; iVar4 = iVar4 + 1) {
    local_138 = (double)iVar4 * local_e0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_98,&local_138);
    local_148 = Phi(this,local_138,local_140,local_100,local_f8,local_110,local_108,local_f0,
                    local_e8);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_b8,&local_148);
  }
  CubicSpline::addPoints
            (local_130._M_ptr,(vector<double,_std::allocator<double>_> *)&local_98,
             (vector<double,_std::allocator<double>_> *)&local_b8);
  std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_78,&local_130);
  pVar7 = CubicSpline::getLimits
                    (local_78.phi.
                     super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_78.rcut = pVar7.second;
  local_78.explicitlySet = true;
  iVar4 = AtomType::getIdent(local_118);
  local_148 = (RealType)CONCAT44(local_148._4_4_,iVar4);
  local_14c = AtomType::getIdent(local_120);
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,(int *)&local_148);
  if (pVar6.second == false) {
    iVar4 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_148._0_4_];
  }
  else {
    iVar4 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_148._0_4_] = iVar4;
    this->nEAM_ = iVar4 + 1;
  }
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_14c);
  if (pVar6.second == false) {
    iVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_14c];
    iVar1 = this->nEAM_;
  }
  else {
    iVar2 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_14c] = iVar2;
    iVar1 = iVar2 + 1;
    this->nEAM_ = iVar1;
  }
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(this_00,(long)iVar1);
  lVar5 = (long)iVar4;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)this->nEAM_);
  lVar3 = (long)iVar2;
  EAMInteractionData::operator=
            ((EAMInteractionData *)
             (lVar3 * 0x40 +
             *(long *)&(this_00->
                       super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar5].
                       super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                       ._M_impl.super__Vector_impl_data),&local_78);
  if (iVar2 != iVar4) {
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar3,(long)this->nEAM_);
    EAMInteractionData::operator=
              ((EAMInteractionData *)
               (lVar5 * 0x40 +
               *(long *)&(this_00->
                         super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar3].
                         super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                         ._M_impl.super__Vector_impl_data),&local_78);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  EAMInteractionData::~EAMInteractionData(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType re, RealType alpha, RealType beta,
                                   RealType A, RealType B, RealType kappa,
                                   RealType lambda) {
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    EAMInteractionData mixer;
    std::vector<RealType> rVals;
    std::vector<RealType> phiVals;
    std::vector<RealType> jVals;

    int Nr = 2000;
    RealType r;

    // default to FCC if we don't specify HCP or BCC:
    // RealType rcut = sqrt(5.0) * re;
    RealType rcut = std::min(12.0, std::max(9.0, 4.0 * re));
    RealType dr   = rcut / (RealType)(Nr - 1);

    for (int i = 0; i < Nr; i++) {
      r = RealType(i) * dr;
      rVals.push_back(r);
      phiVals.push_back(Phi(r, re, A, B, alpha, beta, kappa, lambda));
    }
    cs->addPoints(rVals, phiVals);
    mixer.phi           = cs;
    mixer.rcut          = mixer.phi->getLimits().second;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;
    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }